

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosCommMPI.cpp
# Opt level: O3

CommImplMPI * __thiscall
adios2::helper::CommImplMPI::Win_allocate_shared
          (CommImplMPI *this,size_t size,int disp_unit,void *baseptr,string *hint)

{
  int value;
  long *plVar1;
  long *plVar2;
  size_type *psVar3;
  undefined4 in_register_00000014;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  plVar1 = (long *)operator_new(0x10);
  *plVar1 = (long)&PTR__CommWinImplMPI_00164818;
  value = MPI_Win_allocate_shared
                    (CONCAT44(in_register_00000014,disp_unit),(ulong)baseptr & 0xffffffff,
                     &ompi_mpi_info_null,*(undefined8 *)(size + 8),hint,plVar1 + 1);
  std::operator+(&local_50,"in call to Win_allocate_shared ",in_R9);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  psVar3 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3) {
    local_70.field_2._M_allocated_capacity = *psVar3;
    local_70.field_2._8_8_ = plVar2[3];
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar3;
    local_70._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_70._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  anon_unknown_1::CheckMPIReturn(value,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  adios2::helper::CommImpl::MakeWin(this);
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
  }
  return this;
}

Assistant:

Comm::Win CommImplMPI::Win_allocate_shared(size_t size, int disp_unit, void *baseptr,
                                           const std::string &hint) const
{
    auto w = std::unique_ptr<CommWinImplMPI>(new CommWinImplMPI());
    MPI_Aint asize = static_cast<MPI_Aint>(size);
    CheckMPIReturn(
        MPI_Win_allocate_shared(asize, disp_unit, MPI_INFO_NULL, m_MPIComm, baseptr, &w->m_Win),
        "in call to Win_allocate_shared " + hint + "\n");
    return MakeWin(std::move(w));
}